

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

void pm_read_short(PmInternal *midi,PmEvent *event)

{
  uint uVar1;
  int iVar2;
  PmError PVar3;
  int status;
  PmEvent *event_local;
  PmInternal *midi_local;
  
  if (midi == (PmInternal *)0x0) {
    __assert_fail("midi != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_common/portmidi.c"
                  ,0x3fb,"void pm_read_short(PmInternal *, PmEvent *)");
  }
  uVar1 = event->message;
  if ((((1 << ((char)((int)(uVar1 & 0xff) >> 4) + 0x10U & 0x1f) & midi->filters) == 0) &&
      ((((uVar1 & 0xf8) != 0xf8 || ((uVar1 & 0xf0) != 0xf0)) ||
       ((1 << ((byte)uVar1 & 0xf) & midi->filters) == 0)))) &&
     (((uVar1 & 0xf0) == 0xf0 || ((1 << ((byte)uVar1 & 0xf) & midi->channel_mask) != 0)))) {
    if ((midi->sysex_in_progress == 0) || ((uVar1 & 0x80) == 0)) {
      PVar3 = Pm_Enqueue(midi->queue,event);
      if (PVar3 == pmBufferOverflow) {
        midi->sysex_in_progress = 0;
      }
    }
    else if ((uVar1 & 0xf8) == 0xf8) {
      iVar2 = midi->sysex_message_count;
      midi->sysex_message_count = iVar2 + 1;
      midi->sysex_message = (uVar1 & 0xff) << ((byte)(iVar2 << 3) & 0x1f) | midi->sysex_message;
      if (midi->sysex_message_count == 4) {
        pm_flush_sysex(midi,event->timestamp);
      }
    }
    else {
      midi->sysex_in_progress = 0;
    }
  }
  return;
}

Assistant:

void pm_read_short(PmInternal *midi, PmEvent *event)
{ 
    int status;
    /* arg checking */
    assert(midi != NULL);
    /* midi filtering is applied here */
    status = Pm_MessageStatus(event->message);
    if (!pm_status_filtered(status, midi->filters)
        && (!is_real_time(status) || 
            !pm_realtime_filtered(status, midi->filters))
        && !pm_channel_filtered(status, midi->channel_mask)) {
        /* if sysex is in progress and we get a status byte, it had
           better be a realtime message or the starting SYSEX byte;
           otherwise, we exit the sysex_in_progress state
         */
        if (midi->sysex_in_progress && (status & MIDI_STATUS_MASK)) {
            /* two choices: real-time or not. If it's real-time, then
             * this should be delivered as a sysex byte because it is
             * embedded in a sysex message
             */
            if (is_real_time(status)) {
                midi->sysex_message |= 
                        (status << (8 * midi->sysex_message_count++));
                if (midi->sysex_message_count == 4) {
                    pm_flush_sysex(midi, event->timestamp);
                }
            } else { /* otherwise, it's not real-time. This interrupts
                      * a sysex message in progress */
                midi->sysex_in_progress = FALSE;
            }
        } else if (Pm_Enqueue(midi->queue, event) == pmBufferOverflow) {
            midi->sysex_in_progress = FALSE;
        }
    }
}